

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O1

void http_on_response_handler______internal(http_s *h,http_settings_s *settings)

{
  FIOBJ FVar1;
  char cVar2;
  fiobj_object_vtable_s *pfVar3;
  uint uVar4;
  uint uVar5;
  fio_str_info_s val;
  fio_str_info_s local_28;
  
  if (http_upgrade_hash == 0) {
    http_upgrade_hash = fio_siphash13("upgrade",7,0x144e87,0x1453b6);
  }
  h->udata = settings->udata;
  FVar1 = fiobj_hash_get2(h->headers,http_upgrade_hash);
  if (FVar1 == 0) {
    (*settings->on_response)(h);
    return;
  }
  if ((FVar1 & 1) != 0) {
    fio_ltocstr(&local_28,(long)FVar1 >> 1);
    goto LAB_001528b8;
  }
  uVar4 = (uint)FVar1 & 6;
  cVar2 = '(';
  switch(uVar4) {
  case 0:
switchD_001527c7_caseD_0:
    cVar2 = *(char *)(FVar1 & 0xfffffffffffffff8);
    break;
  case 4:
switchD_001527c7_caseD_4:
    cVar2 = '*';
    break;
  case 6:
    if ((char)FVar1 == '&') {
      local_28.data = anon_var_dwarf_21a;
      local_28.len._0_4_ = 5;
    }
    else {
      uVar5 = (uint)FVar1 & 0xff;
      if (uVar5 == 0x16) {
        local_28.data = anon_var_dwarf_225;
        local_28.len._0_4_ = 4;
      }
      else {
        if (uVar5 != 6) {
          switch(uVar4) {
          case 0:
            goto switchD_001527c7_caseD_0;
          case 4:
            goto switchD_001527c7_caseD_4;
          case 6:
            cVar2 = (char)FVar1;
          }
          break;
        }
        local_28.data = anon_var_dwarf_20f;
        local_28.len._0_4_ = 4;
      }
    }
    local_28.capa._0_4_ = 0;
    local_28.capa._4_4_ = 0;
    local_28.len._4_4_ = 0;
    goto LAB_001528b8;
  }
  switch(cVar2) {
  case '\'':
    pfVar3 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar3 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar3 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar3 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar3 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar3->to_str)(&local_28,FVar1);
LAB_001528b8:
  (*settings->on_upgrade)(h,local_28.data,CONCAT44(local_28.len._4_4_,(undefined4)local_28.len));
  return;
}

Assistant:

void http_on_response_handler______internal(http_s *h,
                                            http_settings_s *settings) {
  if (!http_upgrade_hash)
    http_upgrade_hash = fiobj_hash_string("upgrade", 7);
  h->udata = settings->udata;
  FIOBJ t = fiobj_hash_get2(h->headers, http_upgrade_hash);
  if (t == FIOBJ_INVALID) {
    settings->on_response(h);
    return;
  } else {
    fio_str_info_s val = fiobj_obj2cstr(t);
    settings->on_upgrade(h, val.data, val.len);
  }
}